

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

SstStream SstReaderOpen(char *Name,SstParams Params,SMPI_Comm comm)

{
  int *rank;
  pthread_mutex_t *__mutex;
  uint uVar1;
  char *__ptr;
  CMConnection p_Var2;
  int iVar3;
  undefined4 uVar4;
  __pid_t _Var5;
  char *pcVar6;
  SstStream Stream;
  CP_Info p_Var7;
  attr_list p_Var8;
  char *pcVar9;
  CP_DP_Interface p_Var10;
  DP_RS_Stream pvVar11;
  void **__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  ulong uVar12;
  int *piVar13;
  _SstParams *p_Var14;
  size_t sVar15;
  CP_PeerConnection *pCVar16;
  undefined8 uVar17;
  SMPI_Comm in_RCX;
  ulong uVar18;
  int *piVar19;
  FFSTypeHandle Type;
  timeval *root_info;
  SMPI_Comm comm_00;
  long lVar20;
  int i;
  long lVar21;
  CMConnection rank0_to_rank0_conn;
  void *free_block;
  _ReaderActivateMsg Msg;
  timeval Stop;
  void *WriterFileID;
  char NeededDataPlane [32];
  _WriterResponseMsg *response;
  void *data_block;
  timeval Start;
  void *dpInfo;
  
  pcVar6 = strdup(Name);
  rank0_to_rank0_conn = (CMConnection)0x0;
  NeededDataPlane[0x10] = '\0';
  NeededDataPlane[0x11] = '\0';
  NeededDataPlane[0x12] = '\0';
  NeededDataPlane[0x13] = '\0';
  NeededDataPlane[0x14] = '\0';
  NeededDataPlane[0x15] = '\0';
  NeededDataPlane[0x16] = '\0';
  NeededDataPlane[0x17] = '\0';
  NeededDataPlane[0x18] = '\0';
  NeededDataPlane[0x19] = '\0';
  NeededDataPlane[0x1a] = '\0';
  NeededDataPlane[0x1b] = '\0';
  NeededDataPlane[0x1c] = '\0';
  NeededDataPlane[0x1d] = '\0';
  NeededDataPlane[0x1e] = '\0';
  NeededDataPlane[0x1f] = '\0';
  NeededDataPlane[0] = '\0';
  NeededDataPlane[1] = '\0';
  NeededDataPlane[2] = '\0';
  NeededDataPlane[3] = '\0';
  NeededDataPlane[4] = '\0';
  NeededDataPlane[5] = '\0';
  NeededDataPlane[6] = '\0';
  NeededDataPlane[7] = '\0';
  NeededDataPlane[8] = '\0';
  NeededDataPlane[9] = '\0';
  NeededDataPlane[10] = '\0';
  NeededDataPlane[0xb] = '\0';
  NeededDataPlane[0xc] = '\0';
  NeededDataPlane[0xd] = '\0';
  NeededDataPlane[0xe] = '\0';
  NeededDataPlane[0xf] = '\0';
  Stream = CP_newStream();
  Stream->Role = ReaderRole;
  Stream->mpiComm = comm;
  rank = &Stream->Rank;
  SMPI_Comm_rank(comm,rank);
  SMPI_Comm_size(Stream->mpiComm,&Stream->CohortSize);
  CP_validateParams(Stream,Params,0);
  Stream->ConfigParams = Params;
  p_Var7 = CP_getCPInfo(Params->ControlModule);
  Stream->CPInfo = p_Var7;
  Stream->FinalTimestep = 0x7fffffffffffffff;
  Stream->LastDPNotifiedTimestep = -1;
  gettimeofday((timeval *)&Start,(__timezone_ptr_t)0x0);
  p_Var8 = ContactWriter(Stream,pcVar6,Params,in_RCX,&rank0_to_rank0_conn,&WriterFileID);
  p_Var2 = rank0_to_rank0_conn;
  if (p_Var8 == (attr_list)0x0) {
    SstStreamDestroy(Stream);
    free(Stream);
    free_block = pcVar6;
LAB_00110395:
    free(free_block);
    return (SstStream)0x0;
  }
  if (*rank == 0) {
    Stop.tv_usec = 0;
    Stop.tv_sec = (__time_t)WriterFileID;
    uVar4 = CMCondition_get(Stream->CPInfo->SharedCM->cm,rank0_to_rank0_conn);
    Stop.tv_usec = CONCAT44(Stop.tv_usec._4_4_,uVar4);
    CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,uVar4,NeededDataPlane);
    iVar3 = CMwrite(p_Var2,Stream->CPInfo->SharedCM->DPQueryFormat,&Stop);
    if (iVar3 != 1) {
      CP_verbose(Stream,CriticalVerbose,
                 "DPQuery message failed to send to writer in SstReaderOpen\n");
    }
    CP_verbose(Stream,PerRankVerbose,
               "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n",pcVar6,
               Stop.tv_usec & 0xffffffff);
    iVar3 = CMCondition_wait(Stream->CPInfo->SharedCM->cm,Stop.tv_usec & 0xffffffff);
    if (iVar3 == 0) {
      pcVar6 = "The writer exited before contact could be made, SST Open failed.\n";
      goto LAB_0011074d;
    }
    CP_verbose(Stream,PerRankVerbose,
               "finished wait writer DPresponse message in read_open, WRITER is using \"%s\" DataPlane\n"
              );
    comm_00 = Stream->mpiComm;
  }
  else {
    comm_00 = Stream->mpiComm;
  }
  SMPI_Bcast(NeededDataPlane,0x20,SMPI_CHAR,0,comm_00);
  p_Var14 = Stream->ConfigParams;
  __ptr = p_Var14->DataTransport;
  pcVar9 = strdup(NeededDataPlane);
  p_Var14->DataTransport = pcVar9;
  p_Var10 = SelectDP(&Svcs,Stream,p_Var14,Stream->Rank);
  Stream->DP_Interface = p_Var10;
  if ((p_Var10 != (CP_DP_Interface)0x0) &&
     (iVar3 = strcmp(p_Var10->DPName,NeededDataPlane), iVar3 != 0)) {
    fprintf(_stderr,
            "The writer is using the %s DataPlane for SST data transport, but the reader has failed to load this transport.  Communication cannot occur.  See the SST DataTransport engine parameter to force a match."
            ,NeededDataPlane);
    return (SstStream)0x0;
  }
  free(__ptr);
  FinalizeCPInfo(Stream->CPInfo,Stream->DP_Interface);
  pvVar11 = (*Stream->DP_Interface->initReader)
                      (&Svcs,Stream,&dpInfo,Stream->ConfigParams,p_Var8,&Stream->Stats);
  Stream->DP_Stream = pvVar11;
  free_attr_list(p_Var8);
  Msg.WSR_Stream = CP_GetContactString(Stream,(attr_list)0x0);
  Stop.tv_sec = (__time_t)&Msg;
  Stop.tv_usec = (__suseconds_t)dpInfo;
  __ptr_00 = CP_consolidateDataToRankZero
                       (Stream,&Stop,Stream->CPInfo->PerRankReaderInfoFormat,&data_block);
  free(Msg.WSR_Stream);
  p_Var2 = rank0_to_rank0_conn;
  if (Stream->Rank == 0) {
    Stop.tv_usec = 0;
    Stop.tv_sec = 0xffffffff;
    Msg.WSR_Stream = WriterFileID;
    uVar4 = CMCondition_get(Stream->CPInfo->SharedCM->cm,rank0_to_rank0_conn);
    uVar1 = Stream->CohortSize;
    __ptr_01 = malloc((long)(int)uVar1 << 3);
    __ptr_02 = malloc((long)(int)uVar1 << 3);
    uVar12 = 0;
    uVar18 = 0;
    if (0 < (int)uVar1) {
      uVar18 = (ulong)uVar1;
    }
    for (; uVar18 != uVar12; uVar12 = uVar12 + 1) {
      *(undefined8 *)((long)__ptr_01 + uVar12 * 8) = *__ptr_00[uVar12];
      *(undefined8 *)((long)__ptr_02 + uVar12 * 8) = *(undefined8 *)((long)__ptr_00[uVar12] + 8);
    }
    free(__ptr_00);
    CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,uVar4);
    iVar3 = CMwrite(p_Var2,Stream->CPInfo->SharedCM->ReaderRegisterFormat,&Msg);
    if (iVar3 != 1) {
      CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer in SstReaderOpen\n");
    }
    free(__ptr_01);
    free(__ptr_02);
    CP_verbose(Stream,PerRankVerbose,"Waiting for writer response message in SstReadOpen(\"%s\")\n",
               pcVar6);
    iVar3 = CMCondition_wait(Stream->CPInfo->SharedCM->cm,uVar4);
    if (iVar3 == 0) {
      pcVar6 = "The writer exited before the SST Reader Open could be completed.\n";
LAB_0011074d:
      fwrite(pcVar6,0x41,1,_stderr);
      return (SstStream)0x0;
    }
    CP_verbose(Stream,PerRankVerbose,"finished wait writer response message in read_open\n");
    Type = Stream->CPInfo->CombinedWriterInfoFormat;
    root_info = &Stop;
  }
  else {
    Type = Stream->CPInfo->CombinedWriterInfoFormat;
    root_info = (timeval *)0x0;
  }
  piVar13 = (int *)CP_distributeDataFromRankZero(Stream,root_info,Type,&free_block);
  free(data_block);
  iVar3 = *piVar13;
  if (iVar3 == -1) goto LAB_00110395;
  if (*rank == 0) {
    CP_verbose(Stream,SummaryVerbose,"Opening Reader Stream.\nWriter stream params are:\n");
    CP_dumpParams(Stream,*(_SstParams **)(piVar13 + 2),0);
    CP_verbose(Stream,SummaryVerbose,"Reader stream params are:\n");
    CP_dumpParams(Stream,Stream->ConfigParams,1);
    iVar3 = *piVar13;
  }
  Stream->WriterCohortSize = iVar3;
  p_Var14 = *(_SstParams **)(piVar13 + 2);
  Stream->WriterConfigParams = p_Var14;
  sVar15 = p_Var14->MarshalMethod;
  if (sVar15 == 0) {
    if (*rank == 0) {
      CP_verbose(Stream,SummaryVerbose,"Writer is doing FFS-based marshalling\n");
      p_Var14 = Stream->WriterConfigParams;
      sVar15 = p_Var14->MarshalMethod;
      goto LAB_00110366;
    }
  }
  else {
LAB_00110366:
    if ((sVar15 == 1) && (*rank == 0)) {
      CP_verbose(Stream,SummaryVerbose,"Writer is doing BP-based marshalling\n");
      p_Var14 = Stream->WriterConfigParams;
    }
  }
  sVar15 = p_Var14->CPCommPattern;
  if (sVar15 == 0) {
    if (*rank == 0) {
      CP_verbose(Stream,SummaryVerbose,
                 "Writer is using Minimum Connection Communication pattern (min)\n");
      sVar15 = Stream->WriterConfigParams->CPCommPattern;
      goto LAB_001103b5;
    }
  }
  else {
LAB_001103b5:
    if ((sVar15 == 1) && (*rank == 0)) {
      CP_verbose(Stream,SummaryVerbose,"Writer is using Peer-based Communication pattern (peer)\n");
    }
  }
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->ReaderTimestep = *(long *)(piVar13 + 4) + -1;
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    getPeerArrays(Stream->CohortSize,Stream->Rank,Stream->WriterCohortSize,&Stream->Peers,
                  (int **)0x0);
    do {
      if (Stream->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
        _Var5 = getpid();
        pthread_self();
        CP_verbose(Stream,PerRankVerbose,"(PID %lx, TID %lx) Waiting for first Peer notification\n",
                   (long)_Var5);
      }
      else {
        iVar3 = 0;
        for (piVar19 = Stream->Peers; (long)*piVar19 != -1; piVar19 = piVar19 + 1) {
          iVar3 = iVar3 + (uint)(Stream->ConnectionsToWriter[*piVar19].CMconn == (CMConnection)0x0);
        }
        if (iVar3 == 0) goto LAB_001104f9;
        CP_verbose(Stream,PerRankVerbose,"Rank %d waiting for %d forward peer connections\n",
                   (ulong)(uint)*rank);
      }
      pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
    } while( true );
  }
  if (Stream->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
    pCVar16 = (CP_PeerConnection *)calloc(0x18,(long)*piVar13);
    Stream->ConnectionsToWriter = pCVar16;
  }
LAB_00110515:
  lVar20 = 1;
  for (lVar21 = 0; lVar21 < *piVar13; lVar21 = lVar21 + 1) {
    uVar17 = attr_list_from_string(**(undefined8 **)(*(long *)(piVar13 + 6) + lVar21 * 8));
    pCVar16 = Stream->ConnectionsToWriter;
    *(undefined8 *)((long)pCVar16 + lVar20 * 8 + -8) = uVar17;
    (&pCVar16->ContactList)[lVar20] =
         *(attr_list *)(*(long *)(*(long *)(piVar13 + 6) + lVar21 * 8) + 8);
    lVar20 = lVar20 + 3;
  }
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    if (rank0_to_rank0_conn != (CMConnection)0x0) {
      CMConnection_dereference();
    }
  }
  else if (rank0_to_rank0_conn != (CMConnection)0x0) {
    Stream->ConnectionsToWriter->CMconn = rank0_to_rank0_conn;
    CMconn_register_close_handler(rank0_to_rank0_conn,ReaderConnCloseHandler,Stream);
  }
  Stream->Status = Established;
  gettimeofday((timeval *)&Stop,(__timezone_ptr_t)0x0);
  lVar21 = Stop.tv_usec - Start.tv_usec;
  lVar20 = lVar21 + 1000000;
  if (-1 < lVar21) {
    lVar20 = lVar21;
  }
  Stream->OpenTimeSecs =
       (double)((lVar21 >> 0x3f) + (Stop.tv_sec - Start.tv_sec)) + (double)lVar20 / 1000000.0;
  gettimeofday((timeval *)&Stream->ValidStartTime,(__timezone_ptr_t)0x0);
  Stream->Filename = pcVar6;
  Stream->ParamsBlock = free_block;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  AddToLastCallFreeList(Stream);
  (*Stream->DP_Interface->provideWriterDataToReader)
            (&Svcs,Stream->DP_Stream,*piVar13,Stream->ConnectionsToWriter,*(void ***)(piVar13 + 8));
  CP_verbose(Stream,PerRankVerbose,"Sending Reader Activate messages to writer\n");
  Msg.WSR_Stream = (void *)0x0;
  sendOneToEachWriterRank
            (Stream,Stream->CPInfo->SharedCM->ReaderActivateFormat,&Msg,&Msg.WSR_Stream);
  CP_verbose(Stream,PerStepVerbose,"Finish opening Stream \"%s\", starting with Step number %ld\n",
             pcVar6,*(undefined8 *)(piVar13 + 4));
  return Stream;
LAB_001104f9:
  CP_verbose(Stream,PerRankVerbose,"Rank %d has all forward peer connections\n",(ulong)(uint)*rank);
  goto LAB_00110515;
}

Assistant:

SstStream SstReaderOpen(const char *Name, SstParams Params, SMPI_Comm comm)
{
    SstStream Stream;
    void *dpInfo;
    struct _CP_DP_PairInfo **pointers;
    void *data_block;
    void *free_block;
    writer_data_t ReturnData;
    struct _ReaderActivateMsg Msg;
    struct timeval Start, Stop, Diff;
    char *Filename = strdup(Name);
    CMConnection rank0_to_rank0_conn = NULL;
    void *WriterFileID;
    char NeededDataPlane[32] = {0}; // Don't name a data plane longer than 31 chars

    Stream = CP_newStream();
    Stream->Role = ReaderRole;
    Stream->mpiComm = comm;

    SMPI_Comm_rank(Stream->mpiComm, &Stream->Rank);
    SMPI_Comm_size(Stream->mpiComm, &Stream->CohortSize);

    CP_validateParams(Stream, Params, 0 /* reader */);
    Stream->ConfigParams = Params;

    Stream->CPInfo = CP_getCPInfo(Stream->ConfigParams->ControlModule);

    Stream->FinalTimestep = SSIZE_T_MAX; /* set this on close */
    Stream->LastDPNotifiedTimestep = -1;

    gettimeofday(&Start, NULL);

    attr_list WriterContactAttributes =
        ContactWriter(Stream, Filename, Params, comm, &rank0_to_rank0_conn, &WriterFileID);

    if (WriterContactAttributes == NULL)
    {
        SstStreamDestroy(Stream);
        free(Stream);
        free(Filename);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        struct _DPQueryMsg DPQuery;
        memset(&DPQuery, 0, sizeof(DPQuery));

        DPQuery.WriterFile = WriterFileID;
        DPQuery.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);

        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition,
                                    &NeededDataPlane[0]);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->DPQueryFormat, &DPQuery) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "DPQuery message failed to send to writer in SstReaderOpen\n");
        }

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n", Filename,
                   DPQuery.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before contact could be made, "
                            "SST Open failed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "finished wait writer DPresponse message in read_open, "
                   "WRITER is using \"%s\" DataPlane\n",
                   &NeededDataPlane[0]);

        // NeededDP should now contain the name of the dataplane the writer is
        // using
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    else
    {
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    {
        char *RequestedDP = Stream->ConfigParams->DataTransport;
        Stream->ConfigParams->DataTransport = strdup(&NeededDataPlane[0]);
        Stream->DP_Interface = SelectDP(&Svcs, Stream, Stream->ConfigParams, Stream->Rank);
        if (Stream->DP_Interface)
            if (strcmp(Stream->DP_Interface->DPName, &NeededDataPlane[0]) != 0)
            {
                fprintf(stderr,
                        "The writer is using the %s DataPlane for SST data "
                        "transport, but the reader has failed to load this "
                        "transport.  Communication cannot occur.  See the SST "
                        "DataTransport engine parameter to force a match.",
                        NeededDataPlane);
                return NULL;
            }
        if (RequestedDP)
            free(RequestedDP);
    }

    FinalizeCPInfo(Stream->CPInfo, Stream->DP_Interface);

    Stream->DP_Stream = Stream->DP_Interface->initReader(
        &Svcs, Stream, &dpInfo, Stream->ConfigParams, WriterContactAttributes, &Stream->Stats);

    free_attr_list(WriterContactAttributes);

    pointers =
        (struct _CP_DP_PairInfo **)ParticipateInReaderInitDataExchange(Stream, dpInfo, &data_block);

    if (Stream->Rank == 0)
    {
        struct _CombinedWriterInfo WriterData;
        struct _ReaderRegisterMsg ReaderRegister;

        memset(&ReaderRegister, 0, sizeof(ReaderRegister));
        memset(&WriterData, 0, sizeof(WriterData));
        WriterData.WriterCohortSize = -1;
        ReaderRegister.WriterFile = WriterFileID;
        ReaderRegister.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);
        ReaderRegister.ReaderCohortSize = Stream->CohortSize;
        switch (Stream->ConfigParams->SpeculativePreloadMode)
        {
        case SpecPreloadOff:
        case SpecPreloadOn:
            ReaderRegister.SpecPreload =
                (SpeculativePreloadMode)Stream->ConfigParams->SpeculativePreloadMode;
            break;
        case SpecPreloadAuto:
            ReaderRegister.SpecPreload = SpecPreloadOff;
            if (Stream->CohortSize <= Stream->ConfigParams->SpecAutoNodeThreshold)
            {
                ReaderRegister.SpecPreload = SpecPreloadOn;
            }
            break;
        }

        ReaderRegister.CP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        ReaderRegister.DP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        for (int i = 0; i < ReaderRegister.ReaderCohortSize; i++)
        {
            ReaderRegister.CP_ReaderInfo[i] = (CP_ReaderInitInfo)pointers[i]->CP_Info;
            ReaderRegister.DP_ReaderInfo[i] = pointers[i]->DP_Info;
        }
        free(pointers);

        /* the response value is set in the handler */
        volatile struct _WriterResponseMsg *response = NULL;
        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,
                                    ReaderRegister.WriterResponseCondition, (void *)&response);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->ReaderRegisterFormat,
                    &ReaderRegister) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to writer in SstReaderOpen\n");
        }
        free(ReaderRegister.CP_ReaderInfo);
        free(ReaderRegister.DP_ReaderInfo);

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer response message in SstReadOpen(\"%s\")\n", Filename,
                   ReaderRegister.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, ReaderRegister.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before the SST Reader Open "
                            "could be completed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose, "finished wait writer response message in read_open\n");

        if (response)
        {
            WriterData.WriterCohortSize = response->WriterCohortSize;
            WriterData.WriterConfigParams = response->WriterConfigParams;
            WriterData.StartingStepNumber = response->NextStepNumber;
            WriterData.CP_WriterInfo = response->CP_WriterInfo;
            WriterData.DP_WriterInfo = response->DP_WriterInfo;
        }
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &WriterData, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }

    free(data_block);

    if (ReturnData->WriterCohortSize == -1)
    {
        /* Rank 0 found no writer at that contact point, fail the stream */
        free(free_block);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        CP_verbose(Stream, SummaryVerbose, "Opening Reader Stream.\nWriter stream params are:\n");
        CP_dumpParams(Stream, ReturnData->WriterConfigParams, 0 /* writer side */);
        CP_verbose(Stream, SummaryVerbose, "Reader stream params are:\n");
        CP_dumpParams(Stream, Stream->ConfigParams, 1 /* reader side */);
    }

    //    printf("I am reader rank %d, my info on writers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_writer_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    Stream->WriterCohortSize = ReturnData->WriterCohortSize;
    Stream->WriterConfigParams = ReturnData->WriterConfigParams;
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing FFS-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalBP) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing BP-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Minimum Connection Communication pattern (min)\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Peer-based Communication pattern (peer)\n");
    }
    STREAM_MUTEX_LOCK(Stream);
    Stream->ReaderTimestep = ReturnData->StartingStepNumber - 1;

    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        /*
         *  Wait for connections and messages from writer side peers
         */
        getPeerArrays(Stream->CohortSize, Stream->Rank, Stream->WriterCohortSize, &Stream->Peers,
                      NULL);

        while (!HasAllPeers(Stream))
        {
            /* wait until we get the timestep metadata or something else changes
             */
            STREAM_CONDITION_WAIT(Stream);
        }
    }
    else
    {
        if (!Stream->ConnectionsToWriter)
        {
            Stream->ConnectionsToWriter =
                calloc(sizeof(CP_PeerConnection), ReturnData->WriterCohortSize);
        }
    }

    for (int i = 0; i < ReturnData->WriterCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_WriterInfo[i]->ContactInfo);
        Stream->ConnectionsToWriter[i].ContactList = attrs;
        Stream->ConnectionsToWriter[i].RemoteStreamID = ReturnData->CP_WriterInfo[i]->WriterID;
    }

    // Deref the original connection to writer rank 0 (might still be open as a
    // peer)
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        if (rank0_to_rank0_conn)
        {
            CMConnection_dereference(rank0_to_rank0_conn);
        }
    }
    else
    {
        /* only rely on the rank 0 to rank 0 that we already have (if we're rank
         * 0) */
        if (rank0_to_rank0_conn)
        {
            CMConnection conn = rank0_to_rank0_conn;
            Stream->ConnectionsToWriter[0].CMconn = conn;
            CMconn_register_close_handler(conn, ReaderConnCloseHandler, (void *)Stream);
        }
    }
    Stream->Status = Established;
    gettimeofday(&Stop, NULL);
    timersub(&Stop, &Start, &Diff);
    Stream->OpenTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;
    gettimeofday(&Stream->ValidStartTime, NULL);
    Stream->Filename = Filename;
    Stream->ParamsBlock = free_block;
    STREAM_MUTEX_UNLOCK(Stream);
    AddToLastCallFreeList(Stream);
    Stream->DP_Interface->provideWriterDataToReader(
        &Svcs, Stream->DP_Stream, ReturnData->WriterCohortSize, Stream->ConnectionsToWriter,
        ReturnData->DP_WriterInfo);
    CP_verbose(Stream, PerRankVerbose, "Sending Reader Activate messages to writer\n");
    memset(&Msg, 0, sizeof(Msg));
    sendOneToEachWriterRank(Stream, Stream->CPInfo->SharedCM->ReaderActivateFormat, &Msg,
                            &Msg.WSR_Stream);
    CP_verbose(Stream, PerStepVerbose,
               "Finish opening Stream \"%s\", starting with Step number %ld\n", Filename,
               ReturnData->StartingStepNumber);

    return Stream;
}